

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::array_cs_ext::to_list(array *arr)

{
  proxy *in_RDI;
  var lst;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff68;
  proxy *this;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *args_1;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *args;
  any *in_stack_ffffffffffffffb0;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_38;
  
  args_1 = &local_38;
  this = in_RDI;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin(in_stack_ffffffffffffff68);
  args = (_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
         &stack0xffffffffffffffa8;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end(in_stack_ffffffffffffff68);
  any::
  make<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>>
            (args,args_1);
  any::detach(in_stack_ffffffffffffffb0);
  any::any((any *)this,(any *)in_stack_ffffffffffffff68);
  any::~any((any *)0x42d059);
  return (var)in_RDI;
}

Assistant:

var to_list(const array &arr)
		{
			var lst = var::make<list>(arr.begin(), arr.end());
			lst.detach();
			return std::move(lst);
		}